

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v7::detail::dragonbox::check_divisibility_and_divide_by_pow5<1>(uint32_t *n)

{
  uint uVar1;
  bool result;
  uint32_t comparison_mask;
  anon_struct_16_4_49ee83b1 info;
  uint32_t *n_local;
  
  *n = *n * 0xcccd;
  uVar1 = *n;
  *n = *n >> 0x12;
  return (uVar1 & 0xffff) < 0x3334;
}

Assistant:

bool check_divisibility_and_divide_by_pow5(uint32_t& n) FMT_NOEXCEPT {
  static constexpr struct {
    uint32_t magic_number;
    int bits_for_comparison;
    uint32_t threshold;
    int shift_amount;
  } infos[] = {{0xcccd, 16, 0x3333, 18}, {0xa429, 8, 0x0a, 20}};
  constexpr auto info = infos[N - 1];
  n *= info.magic_number;
  const uint32_t comparison_mask = (1u << info.bits_for_comparison) - 1;
  bool result = (n & comparison_mask) <= info.threshold;
  n >>= info.shift_amount;
  return result;
}